

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

float calculateEdginess(Mat *inputImg)

{
  int iVar1;
  int iVar2;
  _InputArray *p_Var3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  _InputArray local_250;
  _OutputArray local_238;
  _InputArray local_220;
  Mat grad;
  int local_200;
  long *local_1c0;
  Mat abs_grad_y;
  Mat abs_grad_x;
  Mat grad_y;
  Mat grad_x;
  
  cv::Mat::Mat(&grad_x);
  cv::Mat::Mat(&grad_y);
  cv::Mat::Mat(&abs_grad_x);
  cv::Mat::Mat(&abs_grad_y);
  local_250.sz.width = 0;
  local_250.sz.height = 0;
  _grad = 0x1010000;
  local_250.flags = 0x2010000;
  local_250.obj = &grad_x;
  cv::Sobel((_InputArray *)&grad,(_OutputArray *)&local_250,0,1,0,3,1.0,0.0,4);
  local_250.sz.width = 0;
  local_250.sz.height = 0;
  _grad = 0x1010000;
  local_250.flags = 0x2010000;
  local_250.obj = &abs_grad_x;
  cv::convertScaleAbs((_InputArray *)&grad,(_OutputArray *)&local_250,1.0,0.0);
  local_250.sz.width = 0;
  local_250.sz.height = 0;
  _grad = 0x1010000;
  local_250.flags = 0x2010000;
  local_250.obj = &grad_y;
  cv::Sobel((_InputArray *)&grad,(_OutputArray *)&local_250,0,0,1,3,1.0,0.0,4);
  local_250.sz.width = 0;
  local_250.sz.height = 0;
  _grad = 0x1010000;
  local_250.flags = 0x2010000;
  local_250.obj = &abs_grad_y;
  cv::convertScaleAbs((_InputArray *)&grad,(_OutputArray *)&local_250,1.0,0.0);
  cv::Mat::Mat(&grad);
  local_250.sz.width = 0;
  local_250.sz.height = 0;
  local_250.flags = 0x1010000;
  local_220.sz.width = 0;
  local_220.sz.height = 0;
  local_238.super__InputArray.sz.width = 0;
  local_238.super__InputArray.sz.height = 0;
  local_220.flags = 0x1010000;
  local_238.super__InputArray.flags = 0x2010000;
  local_250.obj = &abs_grad_x;
  local_238.super__InputArray.obj = (_InputArray *)&grad;
  local_220.obj = &abs_grad_y;
  p_Var3 = (_InputArray *)cv::noArray();
  cv::add(&local_250,&local_220,&local_238,p_Var3,-1);
  local_200 = (int)&grad_y;
  uVar6 = 0;
  uVar5 = (ulong)&grad_y >> 0x20;
  if ((long)&grad_y < 0x100000000) {
    uVar5 = uVar6;
  }
  uVar4 = (ulong)&grad_y & 0xffffffff;
  if (local_200 < 1) {
    uVar4 = uVar6;
  }
  fVar10 = 0.0;
  for (; lVar7 = 0, uVar8 = uVar5, uVar6 != uVar4; uVar6 = uVar6 + 1) {
    while (uVar8 != 0) {
      fVar9 = fVar10 + 1.0;
      if (0x13 < *(byte *)(lVar7 + *local_1c0 * uVar6)) {
        fVar9 = fVar10;
      }
      lVar7 = lVar7 + 1;
      uVar8 = uVar8 - 1;
      fVar10 = fVar9;
    }
  }
  iVar1 = *(int *)(inputImg + 0xc);
  iVar2 = *(int *)(inputImg + 8);
  cv::Mat::~Mat(&grad);
  cv::Mat::~Mat(&abs_grad_y);
  cv::Mat::~Mat(&abs_grad_x);
  cv::Mat::~Mat(&grad_y);
  cv::Mat::~Mat(&grad_x);
  return (fVar10 / (float)(iVar1 * iVar2)) * 100.0;
}

Assistant:

float calculateEdginess(Mat inputImg) {
    float numOfBlurry = 0.0;
    float sum = 0;
    Mat grad_x, grad_y;
    Mat abs_grad_x, abs_grad_y;
    int kernelSize = 3, scale = 1, delta = 0;

    Sobel( inputImg, grad_x, CV_8U, 1, 0, kernelSize, scale, delta, BORDER_DEFAULT );
    convertScaleAbs( grad_x, abs_grad_x );

    Sobel( inputImg, grad_y, CV_8U, 0, 1, kernelSize, scale, delta, BORDER_DEFAULT );
    convertScaleAbs( grad_y, abs_grad_y );

    Mat grad;

    add(abs_grad_x, abs_grad_y, grad);

    for (int i = 0; i < grad.rows; i ++) {
        for (int j = 0; j < grad.cols; j++) {
            sum += (int)(grad.at<uchar>(i,j));
            if ( (int)(grad.at<uchar>(i,j))  < 20) {
                numOfBlurry++;
            }
        }
    }
    return ( numOfBlurry/ (inputImg.rows * inputImg.cols) ) * 100;
}